

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cclock.cpp
# Opt level: O0

void __thiscall CCLock::Reset(CCLock *this,bool shouldTrackThreadId)

{
  pthread_mutexattr_t *local_40;
  pthread_mutex_t *mutex;
  int local_18;
  pthread_mutexattr_t mtconf;
  int err;
  bool shouldTrackThreadId_local;
  CCLock *this_local;
  
  if (*(long *)this->mutexPtr == 0) {
    mtconf.__size[3] = shouldTrackThreadId;
    _err = this;
    if (shouldTrackThreadId) {
      local_18 = pthread_mutexattr_init((pthread_mutexattr_t *)((long)&mutex + 4));
      if (local_18 != 0) {
        fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cclock.cpp"
                ,0x1c,"err == 0","");
        fflush(_stderr);
        abort();
      }
      local_18 = pthread_mutexattr_settype((pthread_mutexattr_t *)((long)&mutex + 4),1);
      if (local_18 != 0) {
        fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cclock.cpp"
                ,0x1d,"err == 0","");
        fflush(_stderr);
        abort();
      }
      local_18 = 0;
    }
    if ((mtconf.__size[3] & 1U) == 0) {
      local_40 = (pthread_mutexattr_t *)0x0;
    }
    else {
      local_40 = (pthread_mutexattr_t *)((long)&mutex + 4);
    }
    local_18 = pthread_mutex_init((pthread_mutex_t *)this,local_40);
    if (local_18 != 0) {
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cclock.cpp"
              ,0x21,"err == 0","");
      fflush(_stderr);
      abort();
    }
    if (((mtconf.__size[3] & 1U) != 0) &&
       (local_18 = pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&mutex + 4)),
       local_18 != 0)) {
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/sync/cclock.cpp"
              ,0x25,"err == 0","");
      fflush(_stderr);
      abort();
    }
  }
  return;
}

Assistant:

void CCLock::Reset(bool shouldTrackThreadId)
{
    Assert(sizeof(pthread_mutex_t) <= sizeof(this->mutexPtr));

    if (*((size_t*)mutexPtr) != 0)
    {
        return; // already initialized
    }

    int err;
    pthread_mutexattr_t mtconf;
    if (shouldTrackThreadId)
    {
        err = pthread_mutexattr_init(&mtconf); Assert(err == 0);
        err = pthread_mutexattr_settype(&mtconf, PTHREAD_MUTEX_RECURSIVE); Assert(err == 0);
    }

    pthread_mutex_t *mutex = (pthread_mutex_t*)this->mutexPtr;
    err = pthread_mutex_init(mutex, shouldTrackThreadId ? &mtconf : NULL); Assert(err == 0);

    if (shouldTrackThreadId)
    {
        err = pthread_mutexattr_destroy(&mtconf); Assert(err == 0);
    }
}